

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMMLexer.cpp
# Opt level: O3

Token __thiscall cmm::CMMLexer::LexString(CMMLexer *this)

{
  LocTy L;
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  char cVar6;
  string local_98;
  int local_74;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  cVar6 = (char)this + '\x18';
  (this->StrVal)._M_string_length = 0;
  *(this->StrVal)._M_dataplus._M_p = '\0';
  do {
    iVar2 = SourceMgr::get(this->SrcMgr);
    if (iVar2 == 0x5c) {
      L = this->SrcMgr->CurrentLoc;
      local_74 = SourceMgr::get(this->SrcMgr);
      if (local_74 == -1) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"end of file in string constant after \\","");
        SourceMgr::Error(this->SrcMgr,this->TokStartLoc,&local_98);
        goto LAB_00106679;
      }
      bVar1 = UnEscapeChar(&local_74);
      if (bVar1) {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x11980f);
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_60 = *plVar4;
          lStack_58 = plVar3[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar4;
          local_70 = (long *)*plVar3;
        }
        local_68 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98.field_2._8_8_ = plVar3[3];
        }
        else {
          local_98.field_2._M_allocated_capacity = *psVar5;
          local_98._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_98._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        SourceMgr::Warning(this->SrcMgr,L,&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        std::__cxx11::string::push_back(cVar6);
      }
    }
    else {
      if (iVar2 == 0x22) {
        return (Token)String;
      }
      if (iVar2 == -1) {
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_98,"end of file in string constant","");
        SourceMgr::Error(this->SrcMgr,this->TokStartLoc,&local_98);
LAB_00106679:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        return (Token)Error;
      }
    }
    std::__cxx11::string::push_back(cVar6);
  } while( true );
}

Assistant:

Token CMMLexer::LexString() {
  StrVal.clear();
  for (;;) {
    int CurChar = getNextChar();

    if (CurChar == '"') {
      // UnEscapeLexed(StrVal);
      return Token::String;
    }

    if (CurChar == std::char_traits<char>::eof()) {
      Error("end of file in string constant");
      return Token::Error;
    }

    if (CurChar == '\\') {
      LocTy Loc = SrcMgr.getLoc();

      CurChar = getNextChar();

      if (CurChar == std::char_traits<char>::eof()) {
        Error("end of file in string constant after \\");
        return Token::Error;
      }

      if (UnEscapeChar(CurChar)) {
        Warning(Loc, "\\" + std::string(1, static_cast<char>(CurChar)) +
            " is an invalid escaping sequence in string literal");
        StrVal.push_back('\\');
      }
    }
    StrVal.push_back(static_cast<char>(CurChar));
  }
}